

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_MidPrint(FFont *font,char *msg)

{
  int textColor;
  DBaseStatusBar *this;
  DHUDMessage *this_00;
  char *len;
  float holdTime;
  char *msg_local;
  FFont *font_local;
  
  if ((StatusBar != (DBaseStatusBar *)0x0) && (screen != (DFrameBuffer *)0x0)) {
    if (msg == (char *)0x0) {
      DBaseStatusBar::DetachMessage(StatusBar,0x52544e43);
    }
    else {
      AddToConsole(-1,
                   "\x1cG\n\x1d\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1f\x1cB\n"
                  );
      AddToConsole(-1,msg);
      len = 
      "\x1cG\n\x1d\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1f\x1c-\n"
      ;
      AddToConsole(-1,
                   "\x1cG\n\x1d\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1f\x1c-\n"
                  );
      this = StatusBar;
      this_00 = (DHUDMessage *)DObject::operator_new((DObject *)0xc0,(size_t)len);
      textColor = PrintColors[5];
      holdTime = FFloatCVar::operator_cast_to_float(&con_midtime);
      DHUDMessage::DHUDMessage(this_00,font,msg,1.5,0.375,0,0,textColor,holdTime);
      DBaseStatusBar::AttachMessage(this,this_00,0x52544e43,0);
    }
  }
  return;
}

Assistant:

void C_MidPrint (FFont *font, const char *msg)
{
	if (StatusBar == NULL || screen == NULL)
		return;

	if (msg != NULL)
	{
		AddToConsole (-1, bar1);
		AddToConsole (-1, msg);
		AddToConsole (-1, bar3);

		StatusBar->AttachMessage (new DHUDMessage (font, msg, 1.5f, 0.375f, 0, 0,
			(EColorRange)PrintColors[PRINTLEVELS], con_midtime), MAKE_ID('C','N','T','R'));
	}
	else
	{
		StatusBar->DetachMessage (MAKE_ID('C','N','T','R'));
	}
}